

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall
inject::context<0>::component_descriptor::component_descriptor(component_descriptor *this)

{
  _Rb_tree_header *p_Var1;
  
  this->id = -1;
  this->allocator = (generic_activator *)0x0;
  this->constructor = (generic_activator *)0x0;
  (this->activators).
  super__List_base<inject::context<0>::generic_activator_*,_std::allocator<inject::context<0>::generic_activator_*>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&this->activators;
  (this->activators).
  super__List_base<inject::context<0>::generic_activator_*,_std::allocator<inject::context<0>::generic_activator_*>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&this->activators;
  (this->activators).
  super__List_base<inject::context<0>::generic_activator_*,_std::allocator<inject::context<0>::generic_activator_*>_>
  ._M_impl._M_node._M_size = 0;
  (this->component_name)._M_dataplus._M_p = (pointer)&(this->component_name).field_2;
  (this->component_name)._M_string_length = 0;
  (this->component_name).field_2._M_local_buf[0] = '\0';
  (this->default_binding)._vptr_binding = (_func_int **)&PTR__binding_0015fb78;
  *(undefined4 *)&(this->default_binding)._what = 0xffffffff;
  *(undefined4 *)((long)&(this->default_binding)._what + 4) = 0xffffffff;
  *(undefined4 *)&(this->default_binding)._to = 0xffffffff;
  *(undefined4 *)((long)&(this->default_binding)._to + 4) = 0xffffffff;
  (this->default_binding)._scope = scope_none;
  (this->component_cast)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->component_cast)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->component_cast)._M_t._M_impl.super__Rb_tree_header;
  (this->component_cast)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->component_cast)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->component_cast)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->activating = false;
  return;
}

Assistant:

component_descriptor() :
        id(INVALID_ID),
        allocator(0),
        constructor(0),
        activating(false) { }